

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

void FillDistancesPrices(CLzmaEnc *p)

{
  UInt32 UVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  UInt32 (*paUVar7) [64];
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  UInt32 *pUVar13;
  CLzmaProb *pCVar14;
  UInt32 *pUVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  int aiStack_238 [4];
  int aiStack_228 [126];
  
  p->matchPriceCount = 0;
  uVar6 = 2;
  do {
    iVar3 = (p->g_FastPos[uVar6] >> 1) - 1;
    bVar2 = (byte)iVar3;
    uVar8 = (p->g_FastPos[uVar6] & 1 | 2) << (bVar2 & 0x1f);
    iVar12 = 0;
    iVar5 = 0;
    if (iVar3 == 0) {
      uVar4 = 1;
    }
    else {
      uVar9 = 1;
      uVar4 = uVar6 & 0xffffffff;
      do {
        uVar17 = (uint)uVar4 & 1;
        uVar22 = (ulong)uVar9;
        uVar9 = uVar17 + uVar9 * 2;
        uVar4 = uVar4 >> 1;
        iVar12 = iVar12 + p->ProbPrices
                          [(-uVar17 & 0x7f0 ^ (uint)p->posEncoders[(ulong)uVar8 * 2 + uVar22]) >> 4]
        ;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      uVar4 = (ulong)uVar9;
      iVar5 = iVar12;
    }
    uVar9 = uVar8 + (int)uVar6;
    uVar8 = p->posEncoders[(ulong)uVar8 * 2 + uVar4] >> 2 & 0xfffffffc;
    aiStack_238[uVar9] = *(int *)((long)p->ProbPrices + (ulong)uVar8) + iVar5;
    aiStack_238[uVar9 + (1 << (bVar2 & 0x1f))] =
         iVar5 + *(int *)((long)p->ProbPrices + (ulong)(uVar8 ^ 0x1fc));
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x40);
  uVar8 = p->distTableSize + 1;
  pUVar13 = p->posSlotPrices[0] + 1;
  pCVar14 = p->posSlotEncoder[0] + 0x20;
  pUVar15 = p->posSlotPrices[0] + 0xf;
  lVar21 = 0x146c;
  lVar16 = 0;
  do {
    if (1 < uVar8) {
      uVar6 = 0;
      do {
        uVar17 = (int)uVar6 + 0x20;
        uVar9 = 0x7f0;
        if ((uVar6 & 1) == 0) {
          uVar9 = 0;
        }
        uVar18 = 0x7f0;
        if ((uVar6 & 2) == 0) {
          uVar18 = 0;
        }
        uVar19 = 0x7f0;
        if ((uVar6 & 4) == 0) {
          uVar19 = 0;
        }
        uVar20 = 0x7f0;
        if ((uVar6 & 8) == 0) {
          uVar20 = 0;
        }
        uVar11 = 0x7f0;
        if ((uVar6 & 0x10) == 0) {
          uVar11 = 0;
        }
        iVar5 = p->ProbPrices[(uVar18 ^ p->posSlotEncoder[lVar16][uVar17 >> 2]) >> 4] +
                p->ProbPrices
                [(uVar9 ^ *(ushort *)
                           ((long)p->posSlotEncoder[lVar16] + (ulong)(uVar17 & 0xfffffffe))) >> 4] +
                p->ProbPrices
                [(uVar19 ^ *(ushort *)
                            ((long)p->posSlotEncoder[lVar16] + (ulong)(uVar17 >> 2 & 0xfffffffe)))
                 >> 4] + p->ProbPrices[(uVar20 ^ p->posSlotEncoder[lVar16][uVar17 >> 4]) >> 4] +
                p->ProbPrices
                [(uVar11 ^ *(ushort *)
                            ((long)p->posSlotEncoder[lVar16] + (ulong)(uVar17 >> 4 & 0xfffffffe)))
                 >> 4];
        uVar9 = pCVar14[uVar6] >> 2 & 0xfffffffc;
        pUVar13[uVar6 * 2 + -1] = *(int *)((long)p->ProbPrices + (ulong)uVar9) + iVar5;
        pUVar13[uVar6 * 2] = iVar5 + *(int *)((long)p->ProbPrices + (ulong)(uVar9 ^ 0x1fc));
        uVar6 = uVar6 + 1;
      } while (uVar8 >> 1 != uVar6);
    }
    if (0xf < uVar8) {
      iVar5 = 0x20;
      lVar10 = 0;
      do {
        pUVar15[lVar10 * 2 + -1] = pUVar15[lVar10 * 2 + -1] + iVar5;
        pUVar15[lVar10 * 2] = pUVar15[lVar10 * 2] + iVar5;
        iVar5 = iVar5 + 0x10;
        lVar10 = lVar10 + 1;
      } while ((ulong)(uVar8 >> 1) - 7 != lVar10);
    }
    paUVar7 = p->posSlotPrices + lVar16;
    p->distancesPrices[lVar16][0] = (*paUVar7)[0];
    p->distancesPrices[lVar16][1] = (*paUVar7)[1];
    p->distancesPrices[lVar16][2] = (*paUVar7)[2];
    p->distancesPrices[lVar16][3] = (*paUVar7)[3];
    lVar10 = 0;
    do {
      UVar1 = (*paUVar7)[p->g_FastPos[lVar10 + 4]];
      *(UInt32 *)((long)p->reps + lVar10 * 4 + lVar21 + -0x54) = aiStack_228[lVar10] + UVar1;
      *(UInt32 *)((long)p->reps + lVar10 * 4 + lVar21 + -0x50) = UVar1 + aiStack_228[lVar10 + 1];
      uVar6 = lVar10 + 4;
      lVar10 = lVar10 + 2;
    } while (uVar6 < 0x7e);
    lVar16 = lVar16 + 1;
    pUVar13 = pUVar13 + 0x40;
    pCVar14 = pCVar14 + 0x40;
    pUVar15 = pUVar15 + 0x40;
    lVar21 = lVar21 + 0x200;
  } while (lVar16 != 4);
  return;
}

Assistant:

Z7_NO_INLINE static void FillDistancesPrices(CLzmaEnc *p)
{
  // int y; for (y = 0; y < 100; y++) {

  UInt32 tempPrices[kNumFullDistances];
  unsigned i, lps;

  const CProbPrice *ProbPrices = p->ProbPrices;
  p->matchPriceCount = 0;

  for (i = kStartPosModelIndex / 2; i < kNumFullDistances / 2; i++)
  {
    unsigned posSlot = GetPosSlot1(i);
    unsigned footerBits = (posSlot >> 1) - 1;
    unsigned base = ((2 | (posSlot & 1)) << footerBits);
    const CLzmaProb *probs = p->posEncoders + (size_t)base * 2;
    // tempPrices[i] = RcTree_ReverseGetPrice(p->posEncoders + base, footerBits, i - base, p->ProbPrices);
    UInt32 price = 0;
    unsigned m = 1;
    unsigned sym = i;
    unsigned offset = (unsigned)1 << footerBits;
    base += i;
    
    if (footerBits)
    do
    {
      unsigned bit = sym & 1;
      sym >>= 1;
      price += GET_PRICEa(probs[m], bit);
      m = (m << 1) + bit;
    }
    while (--footerBits);

    {
      unsigned prob = probs[m];
      tempPrices[base         ] = price + GET_PRICEa_0(prob);
      tempPrices[base + offset] = price + GET_PRICEa_1(prob);
    }
  }

  for (lps = 0; lps < kNumLenToPosStates; lps++)
  {
    unsigned slot;
    unsigned distTableSize2 = (p->distTableSize + 1) >> 1;
    UInt32 *posSlotPrices = p->posSlotPrices[lps];
    const CLzmaProb *probs = p->posSlotEncoder[lps];
    
    for (slot = 0; slot < distTableSize2; slot++)
    {
      // posSlotPrices[slot] = RcTree_GetPrice(encoder, kNumPosSlotBits, slot, p->ProbPrices);
      UInt32 price;
      unsigned bit;
      unsigned sym = slot + (1 << (kNumPosSlotBits - 1));
      unsigned prob;
      bit = sym & 1; sym >>= 1; price  = GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      prob = probs[(size_t)slot + (1 << (kNumPosSlotBits - 1))];
      posSlotPrices[(size_t)slot * 2    ] = price + GET_PRICEa_0(prob);
      posSlotPrices[(size_t)slot * 2 + 1] = price + GET_PRICEa_1(prob);
    }
    
    {
      UInt32 delta = ((UInt32)((kEndPosModelIndex / 2 - 1) - kNumAlignBits) << kNumBitPriceShiftBits);
      for (slot = kEndPosModelIndex / 2; slot < distTableSize2; slot++)
      {
        posSlotPrices[(size_t)slot * 2    ] += delta;
        posSlotPrices[(size_t)slot * 2 + 1] += delta;
        delta += ((UInt32)1 << kNumBitPriceShiftBits);
      }
    }

    {
      UInt32 *dp = p->distancesPrices[lps];
      
      dp[0] = posSlotPrices[0];
      dp[1] = posSlotPrices[1];
      dp[2] = posSlotPrices[2];
      dp[3] = posSlotPrices[3];

      for (i = 4; i < kNumFullDistances; i += 2)
      {
        UInt32 slotPrice = posSlotPrices[GetPosSlot1(i)];
        dp[i    ] = slotPrice + tempPrices[i];
        dp[i + 1] = slotPrice + tempPrices[i + 1];
      }
    }
  }
  // }
}